

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx512bw_popcnt32_mask(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  int iVar10;
  uint uVar11;
  undefined1 (*pauVar12) [64];
  int i;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar35 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar36 [64];
  __m512i masks [16];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  pauVar12 = &local_480;
  lVar13 = 0;
  do {
    auVar16 = vpbroadcastd_avx512f();
    auVar16 = vmovdqa64_avx512f(auVar16);
    *pauVar12 = auVar16;
    lVar13 = lVar13 + 1;
    pauVar12 = pauVar12 + 1;
  } while (lVar13 != 0x10);
  if (len < 0x20) {
    iVar10 = 0;
    auVar33 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    auVar16 = vmovdqa64_avx512f(local_480);
    auVar33 = vmovdqa64_avx512f(local_440);
    auVar31 = vmovdqa64_avx512f(local_400);
    auVar32 = vmovdqa64_avx512f(local_3c0);
    auVar17 = vmovdqa64_avx512f(local_380);
    auVar18 = vmovdqa64_avx512f(local_340);
    auVar19 = vmovdqa64_avx512f(local_300);
    auVar20 = vmovdqa64_avx512f(local_2c0);
    auVar21 = vmovdqa64_avx512f(local_280);
    auVar22 = vmovdqa64_avx512f(local_240);
    auVar23 = vmovdqa64_avx512f(local_200);
    auVar24 = vmovdqa64_avx512f(local_1c0);
    auVar25 = vmovdqa64_avx512f(local_180);
    auVar26 = vmovdqa64_avx512f(local_140);
    auVar27 = vmovdqa64_avx512f(local_100);
    auVar28 = vmovdqa64_avx512f(local_c0);
    auVar34 = ZEXT1664((undefined1  [16])0x0);
    auVar14 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
    auVar35 = ZEXT1664(auVar14);
    lVar13 = 0;
    iVar10 = 0;
    auVar14 = vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
    auVar36 = ZEXT1664(auVar14);
    do {
      auVar29 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + lVar13));
      auVar30 = vpandq_avx512f(auVar16,auVar29);
      uVar1 = vpcmpeqw_avx512bw(auVar30,auVar16);
      iVar10 = iVar10 + POPCOUNT((int)uVar1);
      auVar30 = vpandq_avx512f(auVar33,auVar29);
      uVar1 = vpcmpeqw_avx512bw(auVar30,auVar33);
      auVar30 = vpandq_avx512f(auVar31,auVar29);
      uVar2 = vpcmpeqw_avx512bw(auVar30,auVar31);
      auVar30 = vpandq_avx512f(auVar32,auVar29);
      uVar3 = vpcmpeqw_avx512bw(auVar30,auVar32);
      auVar30 = vpandq_avx512f(auVar17,auVar29);
      uVar4 = vpcmpeqw_avx512bw(auVar30,auVar17);
      auVar30 = vpandq_avx512f(auVar18,auVar29);
      uVar5 = vpcmpeqw_avx512bw(auVar30,auVar18);
      auVar30 = vpandq_avx512f(auVar19,auVar29);
      uVar6 = vpcmpeqw_avx512bw(auVar30,auVar19);
      auVar30 = vpandq_avx512f(auVar20,auVar29);
      uVar7 = vpcmpeqw_avx512bw(auVar30,auVar20);
      auVar30 = vpandq_avx512f(auVar21,auVar29);
      uVar8 = vpcmpeqw_avx512bw(auVar30,auVar21);
      auVar14 = vpinsrd_avx512dq(ZEXT416((uint)uVar5),(int)uVar6,1);
      auVar14 = vpinsrd_avx512dq(auVar14,(int)uVar7,2);
      auVar14 = vpinsrd_avx512dq(auVar14,(int)uVar8,3);
      auVar9 = vpinsrd_avx512dq(ZEXT416((uint)uVar1),(int)uVar2,1);
      auVar9 = vpinsrd_avx512dq(auVar9,(int)uVar3,2);
      auVar9 = vpinsrd_avx512dq(auVar9,(int)uVar4,3);
      auVar15 = vinserti32x4_avx512vl(ZEXT1632(auVar9),auVar14,1);
      auVar15 = vpopcntd_avx512_vpopcntdq(auVar15);
      auVar15 = vpaddd_avx512vl(auVar15,auVar35._0_32_);
      auVar35 = ZEXT3264(auVar15);
      auVar30 = vpandq_avx512f(auVar22,auVar29);
      uVar1 = vpcmpeqw_avx512bw(auVar30,auVar22);
      auVar30 = vpandq_avx512f(auVar23,auVar29);
      uVar2 = vpcmpeqw_avx512bw(auVar30,auVar23);
      auVar30 = vpandq_avx512f(auVar24,auVar29);
      uVar3 = vpcmpeqw_avx512bw(auVar30,auVar24);
      auVar30 = vpandq_avx512f(auVar25,auVar29);
      uVar4 = vpcmpeqw_avx512bw(auVar30,auVar25);
      auVar14 = vpinsrd_avx512dq(ZEXT416((uint)uVar1),(int)uVar2,1);
      auVar14 = vpinsrd_avx512dq(auVar14,(int)uVar3,2);
      auVar14 = vpinsrd_avx512dq(auVar14,(int)uVar4,3);
      auVar14 = vpopcntd_avx512_vpopcntdq(auVar14);
      auVar14 = vpaddd_avx512vl(auVar14,auVar34._0_16_);
      auVar34 = ZEXT1664(auVar14);
      auVar30 = vpandq_avx512f(auVar26,auVar29);
      uVar1 = vpcmpeqw_avx512bw(auVar30,auVar26);
      auVar30 = vpandq_avx512f(auVar27,auVar29);
      uVar2 = vpcmpeqw_avx512bw(auVar30,auVar27);
      auVar14 = vpinsrd_avx512dq(ZEXT416((uint)uVar1),(int)uVar2,1);
      auVar14 = vpopcntd_avx512_vpopcntdq(auVar14);
      auVar14 = vpaddd_avx512vl(auVar14,auVar36._0_16_);
      auVar36 = ZEXT1664(auVar14);
      auVar29 = vpandq_avx512f(auVar28,auVar29);
      vpcmpeqw_avx512bw(auVar29,auVar28);
      lVar13 = lVar13 + 0x40;
    } while ((ulong)(len >> 5) << 6 != lVar13);
    auVar33 = valignd_avx512f(auVar35,auVar35,0xf);
    auVar16._60_4_ = 0;
    auVar16._0_60_ = auVar33._4_60_;
    auVar33 = vpmovsxbd_avx512f(_DAT_001110d0);
    auVar16 = vpermi2d_avx512f(auVar33,auVar16 << 0x20,auVar34);
    auVar33 = vpmovsxbd_avx512f(_DAT_001110e0);
    auVar16 = vpermi2d_avx512f(auVar33,auVar16,auVar36);
    auVar33 = vpbroadcastd_avx512f();
    auVar33._0_60_ = auVar16._0_60_;
  }
  auVar14 = vpinsrd_avx(auVar33._0_16_,iVar10,0);
  auVar16 = vinserti32x4_avx512f(auVar33,auVar14,0);
  uVar11 = len & 0xffffffe0;
  if (uVar11 != len) {
    auVar33 = vpmovsxbd_avx512f(_DAT_00111080);
    auVar31 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar32 = vpbroadcastd_avx512f();
      auVar32 = vpsrlvd_avx512f(auVar32,auVar33);
      auVar32 = vpandd_avx512f(auVar32,auVar31);
      auVar16 = vpaddd_avx512f(auVar32,auVar16);
      uVar11 = uVar11 + 1;
    } while (uVar11 < len);
  }
  auVar16 = vmovdqu64_avx512f(auVar16);
  *(undefined1 (*) [64])flags = auVar16;
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_popcnt32_mask(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i masks[16];
    for (int i = 0; i < 16; ++i) {
        masks[i] = _mm512_set1_epi32(((1 << i) << 16) | (1 << i));
    }
    uint32_t out_counters[16] = {0};

    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

#define UPDATE(pos) out_counters[pos] += PIL_POPCOUNT((uint64_t)_mm512_cmpeq_epu16_mask(_mm512_and_epi32(_mm512_loadu_si512(data_vectors+i), masks[pos]), masks[pos]));
#define BLOCK {                                 \
    UPDATE(0)  UPDATE(1)  UPDATE(2)  UPDATE(3)  \
    UPDATE(4)  UPDATE(5)  UPDATE(6)  UPDATE(7)  \
    UPDATE(8)  UPDATE(9)  UPDATE(10) UPDATE(11) \
    UPDATE(12) UPDATE(13) UPDATE(14) UPDATE(15) \
}

    for (int i = 0; i < n_cycles; ++i) {
        BLOCK
    }

    // residual
    for (int i = n_cycles*32; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

#undef BLOCK
#undef UPDATE

    return 0;
}